

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error string_split(char *string,char delimiter,char ***result,size_t *length)

{
  size_t sVar1;
  _Bool _Var2;
  natwm_error nVar3;
  list *list;
  char *data;
  char **ppcVar4;
  node *pnVar5;
  char **ppcVar6;
  char *local_40;
  char *item;
  
  list = list_create();
  if (list == (list *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  while( true ) {
    local_40 = (char *)0x0;
    item = (char *)0x0;
    nVar3 = string_get_delimiter(string,delimiter,&local_40,(size_t *)&item,false);
    if (nVar3 != NO_ERROR) break;
    list_insert(list,local_40);
    string = string + (long)item + 1;
  }
  if ((nVar3 == NOT_FOUND_ERROR) && (data = string_init(string), data != (char *)0x0)) {
    list_insert(list,data);
    _Var2 = list_is_empty(list);
    if (_Var2) {
      return NOT_FOUND_ERROR;
    }
    sVar1 = list->size;
    ppcVar4 = (char **)malloc(sVar1 * 8);
    if (ppcVar4 != (char **)0x0) {
      pnVar5 = list->head;
      if (pnVar5 != (node *)0x0) {
        ppcVar6 = ppcVar4 + sVar1;
        do {
          ppcVar6 = ppcVar6 + -1;
          *ppcVar6 = (char *)pnVar5->data;
          pnVar5 = pnVar5->next;
        } while (pnVar5 != (node *)0x0);
      }
      *result = ppcVar4;
      *length = list->size;
      nVar3 = NO_ERROR;
      goto LAB_0010b2e3;
    }
  }
  for (pnVar5 = list->head; pnVar5 != (node *)0x0; pnVar5 = pnVar5->next) {
    if (pnVar5->data != (void *)0x0) {
      free(pnVar5->data);
    }
  }
LAB_0010b2e3:
  list_destroy(list);
  return nVar3;
}

Assistant:

enum natwm_error string_split(const char *string, char delimiter, char ***result, size_t *length)
{
        // We will create a list of each item we find, then push them all
        // into an array once we find the total number
        struct list *found_items = list_create();

        if (found_items == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        enum natwm_error err = GENERIC_ERROR;

        for (;;) {
                char *item = NULL;
                size_t delimiter_pos = 0;
                err = string_get_delimiter(string, delimiter, &item, &delimiter_pos, false);

                if (err == NOT_FOUND_ERROR) {
                        // There are no more delimiters in the string, but we
                        // still need to consume the last item
                        char *last_item = string_init(string);

                        if (last_item == NULL) {
                                goto free_and_error;
                        }

                        list_insert(found_items, last_item);

                        break;
                } else if (err != NO_ERROR) {
                        // We have an actual error
                        goto free_and_error;
                }

                list_insert(found_items, item);

                string += ++delimiter_pos;
        }

        if (list_is_empty(found_items)) {
                return NOT_FOUND_ERROR;
        }

        // We should now have a list of items. We can now make an array of them
        char **items = malloc(sizeof(char *) * found_items->size);

        if (items == NULL) {
                goto free_and_error;
        }

        // Walk the list backwards to store the strings in order
        size_t items_index = (found_items->size - 1);

        LIST_FOR_EACH(found_items, item)
        {
                items[items_index] = (char *)item->data;

                --items_index;
        }

        *result = items;
        *length = found_items->size;

        // We have no need for this list anymore
        list_destroy(found_items);

        return NO_ERROR;

free_and_error:
        // We need to make sure to cleanup any memory allocated while finding
        // items before we return an error
        LIST_FOR_EACH(found_items, item)
        {
                if (item && item->data != NULL) {
                        free((char *)item->data);
                }
        }

        list_destroy(found_items);

        return err;
}